

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  int iVar1;
  Type TVar2;
  pointer pIVar3;
  TestEventListeners *this_00;
  TimeInMillis TVar4;
  Random *this_01;
  UnitTestImpl *this_02;
  undefined8 uVar5;
  UnitTestImpl *in_RDI;
  ReactionToSharding in_stack_0000001c;
  UnitTestImpl *in_stack_00000020;
  int test_index_1;
  int j_1;
  int test_index;
  string *result;
  TestPartResult *test_part_result;
  int j;
  TestResult *test_result;
  Timer timer;
  char *in_stack_000000b8;
  int i;
  bool recreate_environments_when_repeating;
  bool gtest_repeat_forever;
  int repeat;
  TestEventListener *repeater;
  bool failed;
  bool has_tests_to_run;
  bool should_shard;
  bool in_subprocess_for_death_test;
  bool gtest_is_initialized_before_run_all_tests;
  UnitTestImpl *in_stack_00000280;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  UnitTestImpl *in_stack_ffffffffffffff30;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
  *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar7;
  uint local_b8;
  int local_b4;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int local_98;
  int local_94;
  int local_90;
  undefined8 local_79;
  long local_58;
  TestPartResult *local_50;
  int local_44;
  TestResult *local_40;
  uint local_2c;
  byte local_26;
  byte local_25;
  uint local_24;
  TestEventListener *local_20;
  byte local_15;
  byte local_14;
  undefined1 local_13;
  byte local_12;
  byte local_11;
  bool bVar8;
  
  local_11 = GTestIsInitialized();
  if ((g_help_flag & 1) == 0) {
    PostFlagParsingInit((UnitTestImpl *)
                        CONCAT17(in_stack_ffffffffffffff47,
                                 CONCAT16(in_stack_ffffffffffffff46,
                                          CONCAT24(in_stack_ffffffffffffff44,
                                                   in_stack_ffffffffffffff40))));
    WriteToShardStatusFileIfNeeded();
    local_12 = 0;
    pIVar3 = std::
             unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             ::get((unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
                    *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    local_12 = pIVar3 != (pointer)0x0;
    local_13 = ShouldShard(in_stack_000000b8,(char *)timer.start_.__d.__r,test_result._7_1_);
    iVar1 = FilterTests(in_stack_00000020,in_stack_0000001c);
    local_14 = 0 < iVar1;
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      if ((FLAGS_gtest_shuffle & 1) == 0) {
        local_b4 = 0;
      }
      else {
        local_b4 = GetRandomSeedFromFlag(in_stack_ffffffffffffff24);
      }
      in_RDI->random_seed_ = local_b4;
      local_15 = 0;
      this_00 = listeners(in_RDI);
      local_20 = TestEventListeners::repeater(this_00);
      TVar4 = GetTimeInMillis();
      in_RDI->start_timestamp_ = TVar4;
      (*local_20->_vptr_TestEventListener[2])(local_20,in_RDI->parent_);
      if ((local_12 & 1) == 0) {
        local_b8 = FLAGS_gtest_repeat;
      }
      else {
        local_b8 = 1;
      }
      local_24 = local_b8;
      local_25 = (int)local_b8 < 0;
      uVar7 = (FLAGS_gtest_recreate_environments_when_repeating & 1) != 0 || (bool)local_25;
      local_2c = 0;
      local_26 = uVar7;
LAB_00580f61:
      bVar8 = (local_25 & 1) != 0;
      uVar6 = bVar8 || local_2c != local_24;
      if (bVar8 || local_2c != local_24) {
        ClearNonAdHocTestResult((UnitTestImpl *)0x580f9d);
        Timer::Timer((Timer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        if (((local_14 & 1) != 0) && ((FLAGS_gtest_shuffle & 1) != 0)) {
          this_01 = (Random *)random(in_RDI);
          Random::Reseed(this_01,in_RDI->random_seed_);
          ShuffleTests(in_RDI);
        }
        (*local_20->_vptr_TestEventListener[3])(local_20,in_RDI->parent_,(ulong)local_2c);
        if ((local_14 & 1) != 0) {
          if ((local_2c == 0) || ((local_26 & 1) != 0)) {
            (*local_20->_vptr_TestEventListener[4])(local_20,in_RDI->parent_);
            ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                      ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
                       in_stack_ffffffffffffff30,
                       (_func_void_Environment_ptr *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
            (*local_20->_vptr_TestEventListener[5])(local_20,in_RDI->parent_);
          }
          bVar8 = Test::IsSkipped();
          if (bVar8) {
            this_02 = GetUnitTestImpl();
            local_40 = current_test_result(this_02);
            local_44 = 0;
            while (in_stack_ffffffffffffff40 = local_44,
                  iVar1 = TestResult::total_part_count((TestResult *)0x5810b0),
                  in_stack_ffffffffffffff40 < iVar1) {
              local_50 = TestResult::GetTestPartResult
                                   ((TestResult *)in_stack_ffffffffffffff30,
                                    in_stack_ffffffffffffff2c);
              TVar2 = TestPartResult::type(local_50);
              if (TVar2 == kSkip) {
                in_stack_ffffffffffffff30 =
                     (UnitTestImpl *)TestPartResult::message((TestPartResult *)0x5810fd);
                in_stack_ffffffffffffff38 =
                     (reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                      *)&local_79;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff58,(allocator<char> *)in_RDI);
                std::allocator<char>::~allocator((allocator<char> *)&local_79);
                local_58 = (long)&local_79 + 1;
                uVar5 = std::__cxx11::string::c_str();
                printf("%s\n",uVar5);
                std::__cxx11::string::~string((string *)((long)&local_79 + 1));
              }
              local_44 = local_44 + 1;
            }
            fflush(_stdout);
          }
          else {
            bVar8 = Test::HasFatalFailure();
            if (bVar8) {
              bVar8 = Test::HasFatalFailure();
              if (bVar8) {
                local_98 = 0;
                while (in_stack_ffffffffffffff24 = local_98,
                      iVar1 = total_test_suite_count((UnitTestImpl *)0x5812c5),
                      in_stack_ffffffffffffff24 < iVar1) {
                  GetMutableSuiteCase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
                  TestSuite::Skip((TestSuite *)
                                  CONCAT17(uVar7,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff44,
                                                                         in_stack_ffffffffffffff40))
                                          ));
                  local_98 = local_98 + 1;
                }
              }
            }
            else {
              local_90 = 0;
              while (in_stack_ffffffffffffff2c = local_90,
                    iVar1 = total_test_suite_count((UnitTestImpl *)0x5811f7),
                    in_stack_ffffffffffffff2c < iVar1) {
                GetMutableSuiteCase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
                TestSuite::Run((TestSuite *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
                if ((FLAGS_gtest_fail_fast & 1) != 0) {
                  GetMutableSuiteCase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
                  bVar8 = TestSuite::Failed((TestSuite *)
                                            CONCAT44(in_stack_ffffffffffffff24,
                                                     in_stack_ffffffffffffff20));
                  local_94 = local_90;
                  if (bVar8) goto LAB_0058124b;
                }
                local_90 = local_90 + 1;
              }
            }
          }
          goto LAB_005812f8;
        }
        goto LAB_00581389;
      }
      (*local_20->_vptr_TestEventListener[0x10])(local_20,in_RDI->parent_);
      if ((local_11 & 1) == 0) {
        ColoredPrintf(kRed,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      bVar8 = (bool)((local_15 ^ 0xff) & 1);
    }
    else {
      ListTestsMatchingFilter(in_stack_00000280);
      bVar8 = true;
    }
  }
  else {
    bVar8 = true;
  }
  return bVar8;
LAB_0058124b:
  while( true ) {
    local_94 = local_94 + 1;
    in_stack_ffffffffffffff28 = local_94;
    iVar1 = total_test_suite_count((UnitTestImpl *)0x58125d);
    if (iVar1 <= in_stack_ffffffffffffff28) break;
    GetMutableSuiteCase(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    TestSuite::Skip((TestSuite *)
                    CONCAT17(uVar7,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff44,
                                                           in_stack_ffffffffffffff40))));
  }
LAB_005812f8:
  if ((local_2c == local_24 - 1) || ((local_26 & 1) != 0)) {
    (*local_20->_vptr_TestEventListener[0xd])(local_20,in_RDI->parent_);
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rbegin
              ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rend
              ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    __std__for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>,void(*)(testing::Environment*)>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_void____testing__Environment____
              ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                *)CONCAT17(uVar7,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff44,
                                                         in_stack_ffffffffffffff40))),
               in_stack_ffffffffffffff38,(_func_void_Environment_ptr *)in_stack_ffffffffffffff30);
    (*local_20->_vptr_TestEventListener[0xe])(local_20,in_RDI->parent_);
  }
LAB_00581389:
  TVar4 = Timer::Elapsed((Timer *)in_stack_ffffffffffffff30);
  in_RDI->elapsed_time_ = TVar4;
  (*local_20->_vptr_TestEventListener[0xf])(local_20,in_RDI->parent_,(ulong)local_2c);
  bVar8 = Passed((UnitTestImpl *)0x5813c8);
  if (!bVar8) {
    local_15 = 1;
  }
  UnshuffleTests(in_stack_ffffffffffffff30);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    iVar1 = GetNextRandomSeed(in_stack_ffffffffffffff64);
    in_RDI->random_seed_ = iVar1;
  }
  local_2c = local_2c + 1;
  goto LAB_00580f61;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test =
      (internal_run_death_test_flag_.get() != nullptr);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG_GET(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG_GET(shuffle)
                     ? GetRandomSeedFromFlag(GTEST_FLAG_GET(random_seed))
                     : 0;

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG_GET(repeat);

  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;

  // Should test environments be set up and torn down for each repeat, or only
  // set up on the first and torn down on the last iteration? If there is no
  // "last" iteration because the tests will repeat forever, always recreate the
  // environments to avoid leaks in case one of the environments is using
  // resources that are external to this process. Without this check there would
  // be no way to clean up those external resources automatically.
  const bool recreate_environments_when_repeating =
      GTEST_FLAG_GET(recreate_environments_when_repeating) ||
      gtest_repeat_forever;

  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG_GET(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand. If test environments aren't
      // recreated for each iteration, only do so on the first iteration.
      if (i == 0 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsSetUpStart(*parent_);
        ForEach(environments_, SetUpEnvironment);
        repeater->OnEnvironmentsSetUpEnd(*parent_);
      }

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG_GET(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards. If test
      // environments aren't recreated for each iteration, only do so on the
      // last iteration.
      if (i == repeat - 1 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsTearDownStart(*parent_);
        std::for_each(environments_.rbegin(), environments_.rend(),
                      TearDownEnvironment);
        repeater->OnEnvironmentsTearDownEnd(*parent_);
      }
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG_GET(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(GTestColor::kRed,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}